

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TextureBufferActiveUniformValidation::iterate(TextureBufferActiveUniformValidation *this)

{
  _Rb_tree_header *p_Var1;
  GLenum GVar2;
  pointer pcVar3;
  void *pvVar4;
  pointer puVar5;
  undefined1 auVar6 [8];
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  size_type __n;
  value_type *__val;
  pointer pTVar19;
  bool bVar20;
  GLint n_active_uniforms;
  GLenum paramVal;
  char *local_250;
  uint local_244;
  key_type local_240;
  GLint type;
  GLenum uniformType;
  GLsizei paramLength;
  vector<int,_std::allocator<int>_> types;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicies;
  GLsizei uniformSize;
  long local_1f0;
  vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *local_1e8;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  resultTypes;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar10 + 0x1680))(this->m_po_id);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xe3);
  local_1e8 = &this->m_texture_params;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_1e8,this->m_tbo_tex_ids);
  (**(code **)(lVar10 + 0x9d8))(this->m_po_id,0x8b86,&n_active_uniforms);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"Error getting value of GL_ACTIVE_UNIFORMS!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xec);
  bVar20 = ((long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
           (ulong)(uint)n_active_uniforms == 0;
  uVar11 = CONCAT71(0x1b724,bVar20);
  if (!bVar20) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Result is different than expected!\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected number of active uniforms: ",0x24);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Result   number of active uniforms: ",0x24);
    std::ostream::operator<<((ostringstream *)local_1a8,n_active_uniforms);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pcVar9 = (char *)operator_new(100);
  pcVar9[0] = '\0';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  pcVar9[8] = '\0';
  pcVar9[9] = '\0';
  pcVar9[10] = '\0';
  pcVar9[0xb] = '\0';
  pcVar9[0xc] = '\0';
  pcVar9[0xd] = '\0';
  pcVar9[0xe] = '\0';
  pcVar9[0xf] = '\0';
  pcVar9[0x10] = '\0';
  pcVar9[0x11] = '\0';
  pcVar9[0x12] = '\0';
  pcVar9[0x13] = '\0';
  pcVar9[0x14] = '\0';
  pcVar9[0x15] = '\0';
  pcVar9[0x16] = '\0';
  pcVar9[0x17] = '\0';
  pcVar9[0x18] = '\0';
  pcVar9[0x19] = '\0';
  pcVar9[0x1a] = '\0';
  pcVar9[0x1b] = '\0';
  pcVar9[0x1c] = '\0';
  pcVar9[0x1d] = '\0';
  pcVar9[0x1e] = '\0';
  pcVar9[0x1f] = '\0';
  pcVar9[0x20] = '\0';
  pcVar9[0x21] = '\0';
  pcVar9[0x22] = '\0';
  pcVar9[0x23] = '\0';
  pcVar9[0x24] = '\0';
  pcVar9[0x25] = '\0';
  pcVar9[0x26] = '\0';
  pcVar9[0x27] = '\0';
  pcVar9[0x28] = '\0';
  pcVar9[0x29] = '\0';
  pcVar9[0x2a] = '\0';
  pcVar9[0x2b] = '\0';
  pcVar9[0x2c] = '\0';
  pcVar9[0x2d] = '\0';
  pcVar9[0x2e] = '\0';
  pcVar9[0x2f] = '\0';
  pcVar9[0x30] = '\0';
  pcVar9[0x31] = '\0';
  pcVar9[0x32] = '\0';
  pcVar9[0x33] = '\0';
  pcVar9[0x34] = '\0';
  pcVar9[0x35] = '\0';
  pcVar9[0x36] = '\0';
  pcVar9[0x37] = '\0';
  pcVar9[0x38] = '\0';
  pcVar9[0x39] = '\0';
  pcVar9[0x3a] = '\0';
  pcVar9[0x3b] = '\0';
  pcVar9[0x3c] = '\0';
  pcVar9[0x3d] = '\0';
  pcVar9[0x3e] = '\0';
  pcVar9[0x3f] = '\0';
  pcVar9[0x40] = '\0';
  pcVar9[0x41] = '\0';
  pcVar9[0x42] = '\0';
  pcVar9[0x43] = '\0';
  pcVar9[0x44] = '\0';
  pcVar9[0x45] = '\0';
  pcVar9[0x46] = '\0';
  pcVar9[0x47] = '\0';
  pcVar9[0x48] = '\0';
  pcVar9[0x49] = '\0';
  pcVar9[0x4a] = '\0';
  pcVar9[0x4b] = '\0';
  pcVar9[0x4c] = '\0';
  pcVar9[0x4d] = '\0';
  pcVar9[0x4e] = '\0';
  pcVar9[0x4f] = '\0';
  pcVar9[0x50] = '\0';
  pcVar9[0x51] = '\0';
  pcVar9[0x52] = '\0';
  pcVar9[0x53] = '\0';
  pcVar9[0x54] = '\0';
  pcVar9[0x55] = '\0';
  pcVar9[0x56] = '\0';
  pcVar9[0x57] = '\0';
  pcVar9[0x58] = '\0';
  pcVar9[0x59] = '\0';
  pcVar9[0x5a] = '\0';
  pcVar9[0x5b] = '\0';
  pcVar9[0x5c] = '\0';
  pcVar9[0x5d] = '\0';
  pcVar9[0x5e] = '\0';
  pcVar9[0x5f] = '\0';
  pcVar9[0x60] = '\0';
  pcVar9[0x61] = '\0';
  pcVar9[0x62] = '\0';
  pcVar9[99] = '\0';
  paramLength = 0;
  uniformSize = 0;
  p_Var1 = &resultTypes._M_t._M_impl.super__Rb_tree_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  local_250 = pcVar9;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (n_active_uniforms == 0) {
    __n = 0;
  }
  else {
    local_244 = (uint)uVar11;
    local_1f0 = lVar10;
    do {
      lVar10 = local_1f0;
      (**(code **)(local_1f0 + 0x750))
                (this->m_po_id,
                 (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,99,&paramLength,&uniformSize,&uniformType,
                 pcVar9);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"Error getting information about active uniform variable!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x106);
      pTVar19 = (this->m_texture_params).
                super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->m_texture_params).
                     super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar19;
      if (lVar10 != 0) {
        uVar11 = (lVar10 >> 4) * -0x5555555555555555;
        uVar17 = 1;
        uVar18 = 0;
        do {
          if (pTVar19[uVar18].m_texture_uniform_type == uniformType) {
            pTVar19 = pTVar19 + uVar18;
            if (pTVar19 != (pointer)0x0) {
              pcVar3 = (pTVar19->m_uniform_name)._M_dataplus._M_p;
              local_1b0 = (undefined1  [8])local_1a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1b0,pcVar3,
                         pcVar3 + (pTVar19->m_uniform_name)._M_string_length);
              auVar6 = local_1b0;
              iVar7 = strncmp(local_250,(char *)local_1b0,100);
              if (auVar6 != (undefined1  [8])local_1a0) {
                operator_delete((void *)auVar6,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              pcVar9 = local_250;
              if (iVar7 == 0) goto LAB_00d55f7b;
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"For :",5);
              pcVar9 = getUniformTypeName(this,uniformType);
              sVar13 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," type name \n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"expected  uniform name is: ",0x1b);
              indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&indicies.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              pcVar3 = (pTVar19->m_uniform_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&indicies,pcVar3,
                         pcVar3 + (pTVar19->m_uniform_name)._M_string_length);
              puVar5 = indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pcVar9 = local_250;
              if (indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                std::ios::clear((int)local_1a8 + (int)*(_func_int **)((long)local_1a8 + -0x18));
              }
              else {
                sVar13 = strlen((char *)indicies.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)puVar5,sVar13);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"result    uniform name is: ",0x1b);
              sVar13 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((pointer *)
                  indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(indicies.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)indicies.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              goto LAB_00d55f5a;
            }
            break;
          }
          uVar18 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
        } while (uVar18 <= uVar11 && uVar11 - uVar18 != 0);
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Following uniform type was not expected to be defined in current program : \n",
                 0x4c);
      pcVar12 = getUniformTypeName(this,uniformType);
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar12,sVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d55f5a:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      local_244 = 0;
LAB_00d55f7b:
      GVar2 = uniformType;
      pmVar14 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&resultTypes,(key_type *)&types);
      *pmVar14 = GVar2;
      types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    } while ((uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start < (uint)n_active_uniforms);
    if (n_active_uniforms == 0) {
      __n = 0;
    }
    else {
      uVar11 = 0;
      uVar17 = n_active_uniforms;
      do {
        if ((_Rb_tree_header *)resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            p_Var1) {
          GVar2 = (local_1e8->
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar11].m_texture_uniform_type;
          p_Var15 = resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (*(GLenum *)&p_Var15[1].field_0x4 == GVar2) {
              if ((_Rb_tree_header *)p_Var15 != p_Var1) goto LAB_00d56167;
              break;
            }
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        }
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Following uniform type is missing from active uniforms list: ",0x3d);
        pcVar9 = getUniformTypeName(this,(this->m_texture_params).
                                         super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                         m_texture_uniform_type);
        sVar13 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_244 = 0;
        uVar17 = n_active_uniforms;
LAB_00d56167:
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar17);
      __n = (size_type)(int)uVar17;
    }
    uVar11 = (ulong)local_244;
    lVar10 = local_1f0;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&indicies,__n,(allocator_type *)local_1b0);
  std::vector<int,_std::allocator<int>_>::vector
            (&types,(long)n_active_uniforms,(allocator_type *)local_1b0);
  if (n_active_uniforms == 0) {
    uVar18 = 0;
  }
  else {
    uVar16 = 0;
    do {
      indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] = (uint)uVar16;
      uVar16 = uVar16 + 1;
      uVar18 = (ulong)(uint)n_active_uniforms;
    } while (uVar16 < uVar18);
  }
  (**(code **)(lVar10 + 0x770))
            (this->m_po_id,uVar18,
             indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x8a37,
             CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start));
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"Error getting information about active uniform variables!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x142);
  paramVal = 0;
  if (n_active_uniforms == 0) {
    paramVal = 0x92fa;
    type = -1;
  }
  else {
    do {
      pmVar14 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[](&resultTypes,&paramVal);
      if (*pmVar14 !=
          *(mapped_type *)
           (CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) + (ulong)paramVal * 4)) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Wrong uniform type for index(",0x1d);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"expected uniform type: ",0x17);
        pmVar14 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[](&resultTypes,&paramVal);
        pcVar9 = getUniformTypeName(this,*pmVar14);
        sVar13 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"result   uniform type: ",0x17);
        pcVar9 = getUniformTypeName(this,*(GLenum *)
                                          (CONCAT44(types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                          (ulong)paramVal * 4));
        sVar13 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0;
      }
      paramVal = paramVal + 1;
    } while (paramVal < (uint)n_active_uniforms);
    paramVal = 0x92fa;
    type = -1;
    local_240 = 0;
    if (n_active_uniforms != 0) {
      do {
        (**(code **)(lVar10 + 0x9c8))(this->m_po_id,0x92e1,local_240,1,&paramVal,1,0,&type);
        dVar8 = (**(code **)(lVar10 + 0x800))();
        glu::checkError(dVar8,"Error getting information about one of program resources!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x159);
        pmVar14 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[](&resultTypes,&local_240);
        if (*pmVar14 != type) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Wrong uniform type for index(",0x1d);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"expected uniform type: ",0x17);
          pmVar14 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[](&resultTypes,&local_240);
          pcVar9 = getUniformTypeName(this,*pmVar14);
          sVar13 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"result   uniform type: ",0x17);
          pcVar9 = getUniformTypeName(this,type);
          sVar13 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar11 = 0;
        }
        local_240 = local_240 + 1;
      } while (local_240 < (uint)n_active_uniforms);
    }
  }
  pcVar9 = local_250;
  bVar20 = (uVar11 & 1) == 0;
  if (bVar20) {
    pcVar12 = "Fail";
  }
  else {
    pcVar12 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar20,pcVar12
            );
  pvVar4 = (void *)CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&resultTypes._M_t);
  operator_delete(pcVar9,100);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferActiveUniformValidation::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	/* Configure Program */
	configureProgram(&m_texture_params, m_tbo_tex_ids);

	/* Get number of active uniforms for current program */
	glw::GLint n_active_uniforms;

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORMS, &n_active_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting value of GL_ACTIVE_UNIFORMS!");

	if ((glw::GLuint)n_active_uniforms != m_texture_params.size())
	{
		/* Log error if number of active uniforms different than expected */
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected!\n"
						   << "Expected number of active uniforms: " << m_texture_params.size() << "\n"
						   << "Result   number of active uniforms: " << n_active_uniforms << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	/* Retrieve parameters for specific indices */
	std::vector<glw::GLchar> nameValue(m_param_value_size);
	glw::GLsizei			 paramLength = 0;
	glw::GLsizei			 uniformSize = 0;
	glw::GLenum				 uniformType;

	/* store map of indices and uniform types */
	std::map<glw::GLuint, glw::GLenum> resultTypes;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getActiveUniform(m_po_id, i /* index */, (glw::GLsizei)(m_param_value_size - 1), &paramLength, &uniformSize,
							&uniformType, &nameValue[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variable!");

		/*Check if returned uniform type is one of types defined in current program*/
		const TextureParameters* param = getParamsForType(uniformType);

		if (0 == param)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type was not expected to be defined in current program : \n"
							   << getUniformTypeName(uniformType) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
		else if (strncmp(&nameValue[0], param->get_uniform_name().c_str(), m_param_value_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "For :" << getUniformTypeName(uniformType) << " type name \n"
							   << "expected  uniform name is: " << param->get_uniform_name().c_str() << "\n"
							   << "result    uniform name is: " << &nameValue[0] << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}

		resultTypes[i] = uniformType;
	}

	/* Check if all uniform types defined in program were returned */
	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected uniform type is missing */
		std::map<glw::GLuint, glw::GLenum>::iterator it = resultTypes.begin();
		for (; it != resultTypes.end(); ++it)
		{
			if (it->second == m_texture_params[i].get_texture_uniform_type())
			{
				break;
			}
		}

		/* Log if there is some missing uniform type */
		if (it == resultTypes.end())
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type is missing from active uniforms list: "
							   << getUniformTypeName(m_texture_params[i].get_texture_uniform_type()) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	/* Get all active uniform types using glGetActiveUniformsiv and compare with results from glGetActiveUniform function */
	std::vector<glw::GLuint> indicies(n_active_uniforms);
	std::vector<glw::GLint>  types(n_active_uniforms);

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		indicies[i] = i;
	}

	gl.getActiveUniformsiv(m_po_id, n_active_uniforms, &indicies[0], GL_UNIFORM_TYPE, &types[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variables!");

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected result is different from expected*/
		if (resultTypes[i] != (glw::GLuint)types[i])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(types[i]) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	glw::GLenum paramVal = GL_TYPE;
	glw::GLint  type	 = -1;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getProgramResourceiv(m_po_id, GL_UNIFORM, i /*index */, 1 /* parameters count */,
								&paramVal /* parameter enum */, 1 /* buffer size */, 0, &type);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about one of program resources!");

		if (resultTypes[i] != (glw::GLuint)type)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(type) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}